

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::captureExpectedException(ResultBuilder *this,string *expectedMessage)

{
  ulong uVar1;
  Equals local_88;
  AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_40;
  string *local_18;
  string *expectedMessage_local;
  ResultBuilder *this_local;
  
  local_18 = expectedMessage;
  expectedMessage_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Matchers::Equals(&local_88,local_18,Yes);
    captureExpectedException
              (this,(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_88);
    Matchers::Impl::StdString::Equals::~Equals(&local_88);
  }
  else {
    Matchers::Impl::Generic::
    AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::AllOf
              (&local_40);
    captureExpectedException
              (this,(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_40);
    Matchers::Impl::Generic::
    AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~AllOf
              (&local_40);
  }
  return;
}

Assistant:

void ResultBuilder::captureExpectedException(std::string const& expectedMessage) {
		if (expectedMessage.empty())
			captureExpectedException(Matchers::Impl::Generic::AllOf<std::string>());
		else
			captureExpectedException(Matchers::Equals(expectedMessage));
	}